

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O2

void test_bhdct_delete_then_insert_string_key(planck_unit_test_t *tc)

{
  undefined4 local_b4;
  undefined4 local_b0;
  undefined4 local_ac;
  char key [9];
  ion_dictionary_t dict;
  ion_dictionary_handler_t handler;
  
  key[8] = '\0';
  key[0] = '\0';
  key[1] = '\0';
  key[2] = '\0';
  key[3] = '\0';
  key[4] = '\0';
  key[5] = '\0';
  key[6] = '\0';
  key[7] = '\0';
  bhdct_setup_string_key(tc,&handler,&dict,ion_fill_edge_cases);
  sprintf(key,"k%d",0x3c);
  bhdct_delete(tc,&dict,key,'\0',1,'\x01');
  sprintf(key,"k%d",4);
  bhdct_delete(tc,&dict,key,'\0',1,'\x01');
  sprintf(key,"k%d",0x1f9);
  bhdct_delete(tc,&dict,key,'\0',1,'\x01');
  sprintf(key,"k%d",0x3d);
  local_ac = 0x2c;
  bhdct_insert(tc,&dict,key,&local_ac,'\x01');
  sprintf(key,"k%d",0x43);
  local_b0 = 0x2a;
  bhdct_insert(tc,&dict,key,&local_b0,'\x01');
  sprintf(key,"k%d",0x49);
  local_b4 = 0x30;
  bhdct_insert(tc,&dict,key,&local_b4,'\x01');
  bhdct_takedown(tc,&dict);
  return;
}

Assistant:

void
test_bhdct_delete_then_insert_string_key(
	planck_unit_test_t *tc
) {
	ion_dictionary_handler_t	handler;
	ion_dictionary_t			dict;
	char						key[ION_BHDCT_STRING_KEY_BUFFER_SIZE] = { 0 };

	bhdct_setup_string_key(tc, &handler, &dict, ion_fill_edge_cases);

	sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, 60);
	bhdct_delete(tc, &dict, key, err_ok, 1, boolean_true);

	sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, 4);
	bhdct_delete(tc, &dict, key, err_ok, 1, boolean_true);

	sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, 505);
	bhdct_delete(tc, &dict, key, err_ok, 1, boolean_true);

	sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, 61);
	bhdct_insert(tc, &dict, key, IONIZE(44, int), boolean_true);

	sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, 67);
	bhdct_insert(tc, &dict, key, IONIZE(42, int), boolean_true);

	sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, 73);
	bhdct_insert(tc, &dict, key, IONIZE(48, int), boolean_true);

	bhdct_takedown(tc, &dict);
}